

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile.hpp
# Opt level: O1

Directory *
CompoundFile::loadChildDir
          (map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
           *dirs,int32_t dirID,Stream *stream)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar2;
  mapped_type *pmVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int32_t local_54;
  Directory local_50;
  
  if (dirID != -1) {
    p_Var1 = &(dirs->_M_t)._M_impl.super__Rb_tree_header;
    p_Var5 = (dirs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var1->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < dirID]) {
      if (dirID <= (int)p_Var5[1]._M_color) {
        p_Var4 = p_Var5;
      }
    }
    p_Var5 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, dirID < (int)p_Var4[1]._M_color))
    {
      p_Var5 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var5 == p_Var1) {
      local_54 = dirID;
      (*(stream->super_Stream)._vptr_Stream[4])(stream,(ulong)(uint)(dirID << 7),0);
      paVar2 = &local_50.m_name.field_2;
      local_50.m_name._M_string_length = 0;
      local_50.m_name.field_2._M_local_buf[0] = L'\0';
      local_50.m_type = Empty;
      local_50.m_secID.m_id = -2;
      local_50.m_streamSize = 0;
      local_50.m_rightChild = -1;
      local_50.m_leftChild = -1;
      local_50.m_rootNode = -1;
      local_50.m_name._M_dataplus._M_p = (pointer)paVar2;
      Directory::load(&local_50,stream);
      pmVar3 = std::
               map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
               ::operator[](dirs,&local_54);
      std::__cxx11::wstring::_M_assign((wstring *)pmVar3);
      pmVar3->m_leftChild = local_50.m_leftChild;
      pmVar3->m_rootNode = local_50.m_rootNode;
      pmVar3->m_type = local_50.m_type;
      pmVar3->m_secID = (SecID)local_50.m_secID.m_id;
      pmVar3->m_streamSize = local_50.m_streamSize;
      pmVar3->m_rightChild = local_50.m_rightChild;
      pmVar3 = std::
               map<int,_CompoundFile::Directory,_std::less<int>,_std::allocator<std::pair<const_int,_CompoundFile::Directory>_>_>
               ::operator[](dirs,&local_54);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_50.m_name._M_dataplus._M_p == paVar2) {
        return pmVar3;
      }
      operator_delete(local_50.m_name._M_dataplus._M_p,
                      CONCAT44(local_50.m_name.field_2._M_local_buf[1],
                               local_50.m_name.field_2._M_local_buf[0]) * 4 + 4);
      return pmVar3;
    }
  }
  return (Directory *)0x0;
}

Assistant:

inline Directory *
loadChildDir( std::map< int32_t, Directory > & dirs,
	int32_t dirID, Stream & stream )
{
	if( dirID != -1 && dirs.count(dirID) == 0 )
	{
		stream.seek( dirID * dirRecordSize, Stream::FromBeginning );

		Directory dir;
		dir.load( stream );

		dirs[ dirID ] = dir;

		return &dirs[ dirID ];
	}

	return nullptr;
}